

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_outputParameters_Test::TEST_MockSupport_c_outputParameters_Test
          (TEST_MockSupport_c_outputParameters_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockSupport_c).super_Utest._vptr_Utest = (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockSupport_c::TEST_GROUP_CppUTestGroupMockSupport_c
            (&this->super_TEST_GROUP_CppUTestGroupMockSupport_c);
  (this->super_TEST_GROUP_CppUTestGroupMockSupport_c).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002d59b8;
  return;
}

Assistant:

TEST(MockSupport_c, outputParameters)
{
    int param = 1;
    const int retval = 2;
    mock_c()->expectOneCall("foo")->withOutputParameterReturning("out", &retval, sizeof(retval));
    mock_c()->actualCall("foo")->withOutputParameter("out", &param);
    mock_c()->checkExpectations();
    LONGS_EQUAL(2, param);
    LONGS_EQUAL(2, retval);
}